

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# act_obj.c
# Opt level: O2

bool is_carrying(CHAR_DATA *ch,int vnum)

{
  OBJ_DATA *pOVar1;
  OBJ_DATA *pOVar2;
  OBJ_DATA **ppOVar3;
  
  ppOVar3 = &ch->carrying;
  while ((pOVar1 = *ppOVar3, pOVar1 != (OBJ_DATA *)0x0 && (pOVar1->pIndexData->vnum != vnum))) {
    ppOVar3 = &pOVar1->contains;
    while (pOVar2 = *ppOVar3, pOVar2 != (OBJ_DATA *)0x0) {
      ppOVar3 = &pOVar2->next_content;
      if (pOVar2->pIndexData->vnum == vnum) goto LAB_002c21c9;
    }
    ppOVar3 = &pOVar1->next_content;
  }
LAB_002c21c9:
  return pOVar1 != (OBJ_DATA *)0x0;
}

Assistant:

bool is_carrying(CHAR_DATA *ch, int vnum)
{
	OBJ_DATA *obj, *cont;

	for (obj = ch->carrying; obj; obj = obj->next_content)
	{
		if (obj->pIndexData->vnum == vnum)
			return true;

		for (cont = obj->contains; cont; cont = cont->next_content)
		{
			if (cont->pIndexData->vnum == vnum)
				return true;
		}
	}

	return false;
}